

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O3

void __thiscall amrex::MLCellABecLap::applyOverset(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  int iVar1;
  uint uVar2;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  MFIter mfi;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  if (**(long **)&(this->m_overset_mask).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      != 0) {
    this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    uVar2 = (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[5])(this);
    MFIter::MFIter(&local_90,
                   (FabArrayBase *)
                   **(undefined8 **)
                     &(this->m_overset_mask).
                      super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                      super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        MFIter::tilebox(&local_12c,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::IArrayBox> *)
                   **(undefined8 **)
                     &(this->m_overset_mask).
                      super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                      super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ,&local_90);
        if (0 < (int)uVar2) {
          lVar6 = 0;
          uVar4 = 0;
          do {
            iVar1 = local_12c.smallend.vect[2];
            if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
              do {
                if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                  lVar3 = (long)local_d0.p +
                          ((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride * 4 +
                          ((long)local_12c.smallend.vect[1] - (long)local_d0.begin.y) *
                          local_d0.jstride * 4 + (long)local_d0.begin.x * -4 +
                          (long)local_12c.smallend.vect[0] * 4;
                  lVar5 = (long)local_12c.smallend.vect[1];
                  do {
                    if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                      lVar7 = 0;
                      do {
                        if (*(int *)(lVar3 + lVar7 * 4) == 0) {
                          *(undefined8 *)
                           ((long)local_110.p +
                           lVar7 * 8 +
                           local_110.nstride * lVar6 +
                           ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride * 8 +
                           (lVar5 - local_110.begin.y) * local_110.jstride * 8 +
                           (long)local_110.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8) = 0;
                        }
                        lVar7 = lVar7 + 1;
                      } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                               (int)lVar7);
                    }
                    lVar5 = lVar5 + 1;
                    lVar3 = lVar3 + local_d0.jstride * 4;
                  } while (local_12c.bigend.vect[1] + 1 != (int)lVar5);
                }
                bVar8 = iVar1 != local_12c.bigend.vect[2];
                iVar1 = iVar1 + 1;
              } while (bVar8);
            }
            uVar4 = uVar4 + 1;
            lVar6 = lVar6 + 8;
          } while (uVar4 != uVar2);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyOverset (int amrlev, Any& a_rhs) const
{
    if (m_overset_mask[amrlev][0]) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto& rhs = a_rhs.get<MultiFab>();
        const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*m_overset_mask[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rfab = rhs.array(mfi);
            Array4<int const> const& osm = m_overset_mask[amrlev][0]->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                if (osm(i,j,k) == 0) rfab(i,j,k,n) = 0.0;
            });
        }
    }
}